

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O0

void __thiscall cmRST::cmRST(cmRST *this,ostream *os,string *docroot)

{
  char *pcVar1;
  mapped_type *this_00;
  allocator<char> local_51;
  key_type local_50;
  string *local_20;
  string *docroot_local;
  ostream *os_local;
  cmRST *this_local;
  
  this->OS = os;
  local_20 = docroot;
  docroot_local = (string *)os;
  os_local = (ostream *)this;
  std::__cxx11::string::string((string *)&this->DocRoot,(string *)docroot);
  this->IncludeDepth = 0;
  this->OutputLinePending = false;
  this->LastLineEndedInColonColon = false;
  this->Markup = MarkupNone;
  this->Directive = DirectiveNone;
  cmsys::RegularExpression::RegularExpression
            (&this->CMakeDirective,"^.. (cmake:)?(command|variable)::[ \t]+([^ \t\n]+)$");
  cmsys::RegularExpression::RegularExpression
            (&this->CMakeModuleDirective,"^.. cmake-module::[ \t]+([^ \t\n]+)$");
  cmsys::RegularExpression::RegularExpression
            (&this->ParsedLiteralDirective,"^.. parsed-literal::[ \t]*(.*)$");
  cmsys::RegularExpression::RegularExpression
            (&this->CodeBlockDirective,"^.. code-block::[ \t]*(.*)$");
  cmsys::RegularExpression::RegularExpression
            (&this->ReplaceDirective,"^.. (\\|[^|]+\\|) replace::[ \t]*(.*)$");
  cmsys::RegularExpression::RegularExpression
            (&this->IncludeDirective,"^.. include::[ \t]+([^ \t\n]+)$");
  cmsys::RegularExpression::RegularExpression(&this->TocTreeDirective,"^.. toctree::[ \t]*(.*)$");
  cmsys::RegularExpression::RegularExpression
            (&this->ProductionListDirective,"^.. productionlist::[ \t]*(.*)$");
  cmsys::RegularExpression::RegularExpression(&this->NoteDirective,"^.. note::[ \t]*(.*)$");
  cmsys::RegularExpression::RegularExpression(&this->ModuleRST,"^#\\[(=*)\\[\\.rst:$");
  cmsys::RegularExpression::RegularExpression
            (&this->CMakeRole,
             "(:cmake)?:(command|cpack_gen|generator|variable|envvar|module|policy|prop_cache|prop_dir|prop_gbl|prop_inst|prop_sf|prop_test|prop_tgt|manual):`(<*([^`<]|[^` \t]<)*)([ \t]+<[^`]*>)?`"
            );
  cmsys::RegularExpression::RegularExpression
            (&this->InlineLink,"`(<*([^`<]|[^` \t]<)*)([ \t]+<[^`]*>)?`_");
  cmsys::RegularExpression::RegularExpression(&this->InlineLiteral,"``([^`]*)``");
  cmsys::RegularExpression::RegularExpression
            (&this->Substitution,
             "(^|[^A-Za-z0-9_])((\\|[^| \t\r\n]([^|\r\n]*[^| \t\r\n])?\\|)(__|_|))([^A-Za-z0-9_]|$)"
            );
  cmsys::RegularExpression::RegularExpression(&this->TocTreeLink,"^.*[ \t]+<([^>]+)>$");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->MarkupLines);
  std::__cxx11::string::string((string *)&this->DocDir);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->Replace);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->Replaced);
  std::__cxx11::string::string((string *)&this->ReplaceName);
  pcVar1 = cmVersion::GetCMakeVersion();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"|release|",&local_51);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->Replace,&local_50);
  std::__cxx11::string::operator=((string *)this_00,pcVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  return;
}

Assistant:

cmRST::cmRST(std::ostream& os, std::string docroot)
  : OS(os)
  , DocRoot(std::move(docroot))
  , IncludeDepth(0)
  , OutputLinePending(false)
  , LastLineEndedInColonColon(false)
  , Markup(MarkupNone)
  , Directive(DirectiveNone)
  , CMakeDirective("^.. (cmake:)?("
                   "command|variable"
                   ")::[ \t]+([^ \t\n]+)$")
  , CMakeModuleDirective("^.. cmake-module::[ \t]+([^ \t\n]+)$")
  , ParsedLiteralDirective("^.. parsed-literal::[ \t]*(.*)$")
  , CodeBlockDirective("^.. code-block::[ \t]*(.*)$")
  , ReplaceDirective("^.. (\\|[^|]+\\|) replace::[ \t]*(.*)$")
  , IncludeDirective("^.. include::[ \t]+([^ \t\n]+)$")
  , TocTreeDirective("^.. toctree::[ \t]*(.*)$")
  , ProductionListDirective("^.. productionlist::[ \t]*(.*)$")
  , NoteDirective("^.. note::[ \t]*(.*)$")
  , ModuleRST("^#\\[(=*)\\[\\.rst:$")
  , CMakeRole("(:cmake)?:("
              "command|cpack_gen|generator|variable|envvar|module|policy|"
              "prop_cache|prop_dir|prop_gbl|prop_inst|prop_sf|"
              "prop_test|prop_tgt|"
              "manual"
              "):`(<*([^`<]|[^` \t]<)*)([ \t]+<[^`]*>)?`")
  , InlineLink("`(<*([^`<]|[^` \t]<)*)([ \t]+<[^`]*>)?`_")
  , InlineLiteral("``([^`]*)``")
  , Substitution("(^|[^A-Za-z0-9_])"
                 "((\\|[^| \t\r\n]([^|\r\n]*[^| \t\r\n])?\\|)(__|_|))"
                 "([^A-Za-z0-9_]|$)")
  , TocTreeLink("^.*[ \t]+<([^>]+)>$")
{
  this->Replace["|release|"] = cmVersion::GetCMakeVersion();
}